

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

int dotypeinv(void)

{
  int iVar1;
  bool local_a9;
  char *prompt;
  object_pick *dummy;
  int pick_list [30];
  int iStack_18;
  boolean billx;
  int unpaid_count;
  int i;
  int n;
  char c;
  
  local_a9 = false;
  if (u.ushops[0] != '\0') {
    iVar1 = doinvbill(0);
    local_a9 = iVar1 != 0;
  }
  pick_list[0x1c]._3_1_ = local_a9;
  if ((invent == (obj *)0x0) && (local_a9 == false)) {
    pline("You aren\'t carrying anything.");
  }
  else {
    pick_list[0x1d] = count_unpaid(invent);
    iStack_18 = 2;
    if (pick_list[0x1c]._3_1_ != '\0') {
      iStack_18 = 0x22;
    }
    iVar1 = query_category("What type of object do you want an inventory of?",invent,iStack_18,
                           (int *)&dummy,1);
    if (iVar1 != 0) {
      this_type = (int)(char)dummy;
      if ((char)dummy == 'x') {
        if (pick_list[0x1c]._3_1_ == '\0') {
          pline("No used-up objects on your shopping bill.");
        }
        else {
          doinvbill(1);
        }
      }
      else if ((char)dummy == 'u') {
        if (pick_list[0x1d] == 0) {
          pline("You are not carrying any unpaid objects.");
        }
        else {
          dounpaid();
        }
      }
      else {
        check_tutorial_oclass(this_type);
        iVar1 = query_objlist((char *)0x0,invent,0xc,(object_pick **)&prompt,-1,this_type_only);
        if (0 < iVar1) {
          free(prompt);
        }
      }
    }
  }
  return 0;
}

Assistant:

int dotypeinv(void)
{
	char c = '\0';
	int n, i = 0;
	int unpaid_count;
	boolean billx = *u.ushops && doinvbill(0);
	int pick_list[30];
	struct object_pick *dummy;
	const char *prompt = "What type of object do you want an inventory of?";

	if (!invent && !billx) {
	    pline("You aren't carrying anything.");
	    return 0;
	}
	unpaid_count = count_unpaid(invent);
	
	i = UNPAID_TYPES;
	if (billx)
	    i |= BILLED_TYPES;
	n = query_category(prompt, invent, i, pick_list, PICK_ONE);
	if (!n)
	    return 0;
	this_type = c = pick_list[0];
	
	if (c == 'x') {
	    if (billx)
		doinvbill(1);
	    else
		pline("No used-up objects on your shopping bill.");
	    return 0;
	}
	if (c == 'u') {
	    if (unpaid_count)
		dounpaid();
	    else
		pline("You are not carrying any unpaid objects.");
	    return 0;
	}

	check_tutorial_oclass(this_type);

	if (query_objlist(NULL, invent, USE_INVLET | INVORDER_SORT,
			  &dummy, PICK_INVACTION, this_type_only) > 0)
	    free(dummy);
	return 0;
}